

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

uint32_t get_meta_pos(lyd_meta *meta)

{
  lyd_meta *plVar1;
  uint32_t uVar2;
  lyd_meta **pplVar3;
  
  pplVar3 = &meta->parent->meta;
  uVar2 = 0;
  while( true ) {
    plVar1 = *pplVar3;
    if ((plVar1 == (lyd_meta *)0x0) || (plVar1 == meta)) break;
    uVar2 = uVar2 + 1;
    pplVar3 = &plVar1->next;
  }
  if (plVar1 != (lyd_meta *)0x0) {
    return uVar2;
  }
  __assert_fail("meta2",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                0x634,"uint32_t get_meta_pos(struct lyd_meta *)");
}

Assistant:

static uint32_t
get_meta_pos(struct lyd_meta *meta)
{
    uint32_t pos = 0;
    struct lyd_meta *meta2;

    for (meta2 = meta->parent->meta; meta2 && (meta2 != meta); meta2 = meta2->next) {
        ++pos;
    }

    assert(meta2);
    return pos;
}